

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

Nonnull<char_*> absl::numbers_internal::FastIntToBuffer(uint32_t n,Nonnull<char_*> out_str)

{
  ulong uVar1;
  uint64_t uVar2;
  long *plVar3;
  
  if (n < 10) {
    *out_str = (byte)n | 0x30;
    plVar3 = (long *)(out_str + 1);
  }
  else {
    if (n < 100000000) {
      uVar2 = anon_unknown_0::PrepareEightDigits(n);
      if (uVar2 == 0) {
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0xf4,
                      "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar1 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      *(uint64_t *)out_str = uVar2 + 0x3030303030303030 >> ((byte)uVar1 & 0x38);
      plVar3 = (long *)(out_str + -(uVar1 >> 3 & 0x1fffffff));
    }
    else {
      uVar2 = anon_unknown_0::PrepareEightDigits(n % 100000000);
      plVar3 = (long *)anon_unknown_0::EncodeHundred(n / 100000000,out_str);
      *plVar3 = uVar2 + 0x3030303030303030;
    }
    plVar3 = plVar3 + 1;
  }
  *(char *)plVar3 = '\0';
  return (Nonnull<char_*>)plVar3;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    uint32_t n, absl::Nonnull<char*> out_str) {
  out_str = EncodeFullU32(n, out_str);
  *out_str = '\0';
  return out_str;
}